

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  byte bVar1;
  curl_proxytype cVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  _Bool _Var7;
  CURLcode CVar8;
  int iVar9;
  CURLcode CVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  connectdata *pcVar13;
  char *pcVar14;
  curl_llist *pcVar15;
  size_t sVar16;
  byte *pbVar17;
  char *pcVar18;
  _Bool *p_Var19;
  size_t sVar20;
  char *pcVar21;
  void *pvVar22;
  undefined8 uVar23;
  size_t sVar24;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  connectdata *pcVar25;
  char cVar26;
  char **ppcVar27;
  long lVar28;
  Curl_handler *pCVar29;
  char **ppcVar30;
  Curl_handler **ppCVar31;
  _Bool _Var32;
  bool bVar33;
  timeval tVar34;
  _Bool waitpipe;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  char slashbuf [4];
  char *newname;
  connectdata *conn_temp;
  char *optionsp;
  char *passwdp;
  char protobuf [16];
  _Bool local_c2;
  _Bool local_c1;
  _Bool *local_c0;
  byte *local_b8;
  char **local_b0;
  size_t local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  Curl_easy *local_78;
  size_t local_70;
  connectdata *local_68;
  char *local_60;
  char *local_58;
  _Bool *local_50;
  _Bool local_48 [24];
  
  pcVar14 = (char *)0x0;
  *asyncp = false;
  local_68 = (connectdata *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_90 = (char *)0x0;
  local_c1 = false;
  local_c2 = false;
  local_50 = protocol_done;
  pCVar11 = (Curl_easy *)Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    pcVar18 = (char *)0x0;
    CVar8 = CURLE_URL_MALFORMAT;
    goto LAB_0011e359;
  }
  local_78 = pCVar11;
  local_70 = sVar12;
  pcVar13 = (connectdata *)(*Curl_ccalloc)(1,0x700);
  if (pcVar13 == (connectdata *)0x0) {
LAB_0011e1b2:
    pcVar13 = (connectdata *)0x0;
  }
  else {
    pcVar13->handler = &Curl_handler_dummy;
    pcVar13->connection_id = -1;
    pcVar13->port = -1;
    pcVar13->remote_port = -1;
    pcVar13->sock[0] = -1;
    pcVar13->sock[1] = -1;
    pcVar13->tempsock[0] = -1;
    pcVar13->tempsock[1] = -1;
    Curl_conncontrol(pcVar13,1);
    tVar34 = curlx_tvnow();
    pcVar13->created = tVar34;
    pcVar13->data = data;
    cVar2 = (data->set).proxytype;
    (pcVar13->http_proxy).proxytype = cVar2;
    (pcVar13->socks_proxy).proxytype = CURLPROXY_SOCKS4;
    pcVar14 = (data->set).str[0x15];
    if (pcVar14 == (char *)0x0) {
      _Var32 = false;
    }
    else {
      _Var32 = *pcVar14 != '\0';
    }
    (pcVar13->bits).proxy = _Var32;
    (pcVar13->bits).httpproxy = (_Bool)(cVar2 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var32);
    (pcVar13->bits).socksproxy = (_Bool)(cVar2 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var32);
    pcVar14 = (data->set).str[0x16];
    if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
      (pcVar13->bits).proxy = true;
      (pcVar13->bits).socksproxy = true;
    }
    (pcVar13->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
    (pcVar13->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar13->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
    (pcVar13->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar13->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    (pcVar13->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
    (pcVar13->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
    (pcVar13->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
    (pcVar13->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
    (pcVar13->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
    (pcVar13->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
    pcVar13->ip_version = (data->set).ipver;
    _Var32 = Curl_pipeline_wanted(data->multi,1);
    if ((_Var32) && (pcVar13->master_buffer == (char *)0x0)) {
      pcVar14 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar13->master_buffer = pcVar14;
      if (pcVar14 != (char *)0x0) goto LAB_0011e131;
LAB_0011e16b:
      Curl_llist_destroy(pcVar13->send_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar13->recv_pipe,(void *)0x0);
      pcVar13->send_pipe = (curl_llist *)0x0;
      pcVar13->recv_pipe = (curl_llist *)0x0;
      (*Curl_cfree)(pcVar13->master_buffer);
      (*Curl_cfree)(pcVar13->localdev);
      (*Curl_cfree)(pcVar13);
      goto LAB_0011e1b2;
    }
LAB_0011e131:
    pcVar15 = Curl_llist_alloc(llist_dtor);
    pcVar13->send_pipe = pcVar15;
    pcVar15 = Curl_llist_alloc(llist_dtor);
    pcVar13->recv_pipe = pcVar15;
    if (pcVar15 == (curl_llist *)0x0 || pcVar13->send_pipe == (curl_llist *)0x0) goto LAB_0011e16b;
    pcVar14 = (data->set).str[8];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      pcVar13->localdev = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_0011e16b;
    }
    pcVar13->localportrange = (data->set).localportrange;
    pcVar13->localport = (data->set).localport;
    pcVar13->fclosesocket = (data->set).fclosesocket;
    pcVar13->closesocket_client = (data->set).closesocket_client;
  }
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (pcVar13 == (connectdata *)0x0) {
LAB_0011e34f:
    pcVar14 = (char *)0x0;
  }
  else {
    *in_connect = pcVar13;
    sVar16 = strlen((data->change).url);
    sVar20 = 0x100;
    if (0x100 < sVar16) {
      sVar20 = sVar16;
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
    pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
    (data->state).pathbuffer = pcVar14;
    if (pcVar14 == (char *)0x0) goto LAB_0011e34f;
    (data->state).path = pcVar14;
    pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
    (pcVar13->host).rawalloc = pcVar14;
    if (pcVar14 == (char *)0x0) {
      (*Curl_cfree)((data->state).pathbuffer);
      (data->state).pathbuffer = (char *)0x0;
      (data->state).path = (char *)0x0;
      goto LAB_0011e34f;
    }
    (pcVar13->host).name = pcVar14;
    *pcVar14 = '\0';
    local_98 = (*Curl_cstrdup)("");
    local_a0 = (*Curl_cstrdup)("");
    local_c0 = (_Bool *)0x14f094;
    local_90 = (*Curl_cstrdup)("");
    if (local_90 == (char *)0x0 || (local_a0 == (char *)0x0 || local_98 == (char *)0x0))
    goto LAB_0011e34f;
    pbVar17 = (byte *)(data->state).path;
    pbVar4 = (byte *)(data->change).url;
    pcVar14 = strpbrk((char *)pbVar4,"\r\n");
    if (pcVar14 == (char *)0x0) {
      local_b8 = pbVar17;
      if (*pbVar4 == 0x3a) {
        pcVar14 = "Bad URL, colon is first character";
        goto LAB_0011e41e;
      }
      if ((((0x19 < (byte)((*pbVar4 & 0xdf) + 0xbf)) || (pbVar4[1] != 0x3a)) ||
          (pcVar14 = (data->set).str[7], pcVar14 == (char *)0x0)) ||
         (iVar9 = Curl_strcasecompare(pcVar14,"file"), iVar9 == 0)) {
        lVar28 = 0;
        do {
          cVar26 = (data->change).url[lVar28];
          bVar33 = false;
          if ((cVar26 == '\0') || (bVar33 = false, cVar26 == '/')) goto LAB_0011e7db;
          if (cVar26 == ':') {
            bVar33 = true;
            goto LAB_0011e7db;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x10);
      }
      bVar33 = false;
LAB_0011e7db:
      if (bVar33) {
        iVar9 = Curl_strncasecompare((data->change).url,"file:",5);
        if (iVar9 == 0) {
          if (!bVar33) goto LAB_0011e804;
          goto LAB_0011e8b4;
        }
LAB_0011e829:
        pcVar14 = "%[^\n]";
        if (bVar33) {
          pcVar14 = "%*15[^\n/:]:%[^\n]";
        }
        iVar9 = __isoc99_sscanf((data->change).url,pcVar14,local_b8);
        if (iVar9 == 1) {
          pbVar17 = local_b8;
          if (((bVar33) && (*local_b8 == 0x2f)) && (local_b8[1] == 0x2f)) {
            pbVar4 = local_b8 + 2;
            sVar20 = strlen((char *)pbVar4);
            pbVar17 = local_b8;
            memmove(local_b8,pbVar4,sVar20 + 1);
          }
          pbVar4 = local_b8;
          if ((byte)((*pbVar17 & 0xdf) + 0xbf) < 0x1a) {
            bVar33 = pbVar17[1] == 0x3a;
          }
          else {
            bVar33 = false;
          }
          if (*pbVar17 == 0x2f || bVar33) {
LAB_0011edc2:
            if (bVar33) {
              pcVar14 = "File drive letters are only accepted in MSDOS/Windows.";
              goto LAB_0011edcd;
            }
            local_c0 = (_Bool *)0x14bf59;
            bVar33 = true;
          }
          else {
            iVar9 = curl_strnequal("localhost/",(char *)local_b8,10);
            if ((iVar9 == 0) && (iVar9 = curl_strnequal("127.0.0.1/",(char *)pbVar4,10), iVar9 == 0)
               ) {
              Curl_failf(data,"Invalid file://hostname/, expected localhost or 127.0.0.1 or none");
              bVar5 = false;
            }
            else {
              pbVar17 = pbVar4 + 9;
              if (pbVar4[10] == 0x2f) {
                pbVar17 = pbVar4 + 10;
              }
              sVar20 = strlen((char *)pbVar17);
              memmove(pbVar4,pbVar17,sVar20 + 1);
              bVar5 = true;
              if ((byte)((*pbVar4 & 0xdf) + 0xbf) < 0x1a) {
                bVar33 = pbVar4[1] == 0x3a;
              }
              else {
                bVar33 = false;
              }
            }
            if (bVar5) goto LAB_0011edc2;
            bVar33 = false;
          }
        }
        else {
          pcVar14 = "Bad URL";
LAB_0011edcd:
          bVar33 = false;
          Curl_failf(data,pcVar14);
        }
        ppcVar27 = (char **)0x3;
        bVar5 = false;
        bVar6 = false;
        if (bVar33) {
LAB_0011f132:
          pcVar14 = (pcVar13->host).name;
          local_b0 = ppcVar27;
          pcVar21 = strchr(pcVar14,0x40);
          pcVar18 = pcVar21 + 1;
          if (pcVar21 == (char *)0x0) {
            pcVar18 = pcVar14;
          }
          pcVar14 = strchr(pcVar18,0x3f);
          if (pcVar14 == (char *)0x0) {
            pbVar17 = local_b8;
            if (*local_b8 == 0) {
              local_b8[0] = 0x2f;
              local_b8[1] = 0;
              pvVar22 = (void *)0x0;
              goto LAB_0011f1b6;
            }
            uVar23 = 0;
          }
          else {
            local_a8 = strlen(pcVar14);
            pbVar17 = local_b8;
            sVar20 = strlen((char *)local_b8);
            memmove(pbVar17 + local_a8 + 1,pbVar17,sVar20 + 1);
            pvVar22 = memcpy(pbVar17 + 1,pcVar14,local_a8);
            *pbVar17 = 0x2f;
            *pcVar14 = '\0';
LAB_0011f1b6:
            uVar23 = CONCAT71((int7)((ulong)pvVar22 >> 8),1);
          }
          pbVar4 = local_b8;
          bVar6 = bVar5;
          if (*pbVar17 == 0x2f) {
            if ((data->set).path_as_is != false) goto LAB_0011f263;
            local_a8 = CONCAT44(local_a8._4_4_,(int)uVar23);
            pbVar17 = (byte *)Curl_dedotdotify((char *)local_b8);
            if (pbVar17 == (byte *)0x0) {
              ppcVar27 = (char **)0x1b;
LAB_0011f582:
              cVar26 = (char)local_a8;
            }
            else {
              iVar9 = strcmp((char *)pbVar17,(char *)pbVar4);
              if (iVar9 == 0) {
                (*Curl_cfree)(pbVar17);
                ppcVar27 = local_b0;
                goto LAB_0011f582;
              }
              (*Curl_cfree)((data->state).pathbuffer);
              (data->state).pathbuffer = (char *)pbVar17;
              (data->state).path = (char *)pbVar17;
              cVar26 = '\x01';
              ppcVar27 = local_b0;
              local_b8 = pbVar17;
            }
            if (pbVar17 == (byte *)0x0) goto LAB_0011e42f;
          }
          else {
            sVar20 = strlen((char *)pbVar17);
            memmove(pbVar17 + 1,pbVar17,sVar20 + 1);
            *pbVar17 = 0x2f;
            uVar23 = 1;
LAB_0011f263:
            cVar26 = (char)uVar23;
            ppcVar27 = local_b0;
          }
          if (cVar26 != '\0') {
            local_b0 = ppcVar27;
            local_a8 = strlen((char *)local_b8);
            sVar20 = strlen((data->change).url);
            sVar16 = strlen((pcVar13->host).name);
            if (!bVar5) {
              sVar24 = strlen(local_c0);
              sVar16 = sVar16 + sVar24 + 3;
            }
            pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
            if (pcVar14 == (char *)0x0) {
              ppcVar27 = (char **)0x1b;
            }
            else {
              memcpy(pcVar14,(data->change).url,sVar16);
              memcpy(pcVar14 + sVar16,local_b8,local_a8 + 1);
              if ((data->change).url_alloc == true) {
                (*Curl_cfree)((data->change).url);
                (data->change).url = (char *)0x0;
                (data->change).url_alloc = false;
              }
              Curl_infof(data,"Rebuilt URL to: %s\n",pcVar14);
              (data->change).url = pcVar14;
              (data->change).url_alloc = true;
              ppcVar27 = local_b0;
            }
            if (pcVar14 == (char *)0x0) goto LAB_0011e42f;
          }
          pCVar29 = &Curl_handler_http;
          ppCVar31 = protocols;
          do {
            ppCVar31 = ppCVar31 + 1;
            iVar9 = Curl_strcasecompare(pCVar29->scheme,local_c0);
            if (iVar9 != 0) {
              if ((((uint)(data->set).allowed_protocols & pCVar29->protocol) != 0) &&
                 (((data->state).this_is_a_follow != true ||
                  (((uint)(data->set).redir_protocols & pCVar29->protocol) != 0)))) {
                pcVar13->given = pCVar29;
                pcVar13->handler = pCVar29;
                ppcVar27 = (char **)0x0;
                bVar33 = true;
                goto LAB_0011f3ed;
              }
              break;
            }
            pCVar29 = *ppCVar31;
          } while (pCVar29 != (Curl_handler *)0x0);
          bVar33 = false;
          Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_c0);
          ppcVar27 = (char **)0x1;
LAB_0011f3ed:
          if (bVar33) {
            local_88 = (char *)0x0;
            local_58 = (char *)0x0;
            local_b0 = (char **)0x0;
            local_60 = (char *)0x0;
            pcVar14 = (pcVar13->host).name;
            pcVar18 = strchr(pcVar14,0x40);
            if (pcVar18 == (char *)0x0) {
LAB_0011f48b:
              (*Curl_cfree)(local_88);
              (*Curl_cfree)(local_58);
              (*Curl_cfree)(local_60);
            }
            else {
              (pcVar13->host).name = pcVar18 + 1;
              if ((data->set).use_netrc == CURL_NETRC_REQUIRED) goto LAB_0011f48b;
              ppcVar30 = (char **)0x0;
              ppcVar27 = &local_60;
              if ((pcVar13->handler->flags >> 10 & 1) == 0) {
                ppcVar27 = ppcVar30;
              }
              CVar10 = parse_login_details(pcVar14,(size_t)(pcVar18 + 1 + ~(ulong)pcVar14),&local_88
                                           ,&local_58,ppcVar27);
              local_b0 = (char **)CONCAT44(extraout_var,CVar10);
              if (CVar10 != CURLE_OK) goto LAB_0011f48b;
              if (local_88 == (char *)0x0) {
LAB_0011f602:
                local_b0 = ppcVar30;
                if (local_58 != (char *)0x0) {
                  CVar10 = Curl_urldecode(data,local_58,0,&local_80,(size_t *)0x0,false);
                  local_b0 = (char **)CONCAT44(extraout_var_00,CVar10);
                  iVar9 = 10;
                  if (CVar10 == CURLE_OK) {
                    (*Curl_cfree)(local_a0);
                    local_a0 = local_80;
                    iVar9 = 0;
                  }
                  if (iVar9 == 10) goto LAB_0011f48b;
                  if (iVar9 != 0) goto LAB_0011f4ad;
                }
                if (local_60 != (char *)0x0) {
                  CVar10 = Curl_urldecode(data,local_60,0,&local_80,(size_t *)0x0,false);
                  local_b0 = (char **)CONCAT44(extraout_var_01,CVar10);
                  iVar9 = 10;
                  if (CVar10 == CURLE_OK) {
                    (*Curl_cfree)(local_90);
                    local_90 = local_80;
                    iVar9 = 0;
                  }
                  if ((iVar9 != 10) && (iVar9 != 0)) goto LAB_0011f4ad;
                }
                goto LAB_0011f48b;
              }
              (pcVar13->bits).userpwd_in_url = true;
              (pcVar13->bits).user_passwd = true;
              ppcVar27 = &local_80;
              CVar10 = Curl_urldecode(data,local_88,0,ppcVar27,(size_t *)0x0,false);
              ppcVar30 = (char **)(ulong)CVar10;
              iVar9 = 10;
              if (CVar10 == CURLE_OK) {
                (*Curl_cfree)(local_98);
                local_98 = local_80;
                iVar9 = 0;
              }
              local_b0 = ppcVar30;
              if (iVar9 == 10) goto LAB_0011f48b;
              local_b0 = ppcVar27;
              if (iVar9 == 0) goto LAB_0011f602;
            }
LAB_0011f4ad:
            ppcVar27 = local_b0;
            if ((int)local_b0 == 0) {
              pcVar14 = (pcVar13->host).name;
              if ((*pcVar14 == '[') && (pcVar14 = strchr(pcVar14,0x25), pcVar14 != (char *)0x0)) {
                lVar28 = 3;
                iVar9 = strncmp("%25",pcVar14,3);
                if (iVar9 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                  lVar28 = 1;
                }
                p_Var19 = (_Bool *)strtoul(pcVar14 + lVar28,&local_88,10);
                pcVar18 = local_88;
                if (*local_88 == ']') {
                  local_c0 = p_Var19;
                  sVar20 = strlen(local_88);
                  memmove(pcVar14,pcVar18,sVar20 + 1);
                  pcVar13->scope_id = (uint)local_c0;
                }
                else {
                  Curl_infof(data,"Invalid IPv6 address format\n");
                }
              }
              uVar3 = (data->set).scope_id;
              if (uVar3 != 0) {
                pcVar13->scope_id = uVar3;
              }
              pcVar14 = strchr((char *)local_b8,0x23);
              ppcVar27 = (char **)0x0;
              if (pcVar14 != (char *)0x0) {
                *pcVar14 = '\0';
                pcVar14 = strchr((data->change).url,0x23);
                if (pcVar14 != (char *)0x0) {
                  *pcVar14 = '\0';
                }
                ppcVar27 = (char **)0x0;
              }
            }
          }
        }
      }
      else {
LAB_0011e804:
        pcVar14 = (data->set).str[7];
        if ((pcVar14 != (char *)0x0) && (iVar9 = Curl_strcasecompare(pcVar14,"file"), iVar9 != 0))
        goto LAB_0011e829;
LAB_0011e8b4:
        pbVar17 = local_b8;
        *local_b8 = 0;
        local_c0 = local_48;
        iVar9 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",local_c0,
                                &local_88,(pcVar13->host).name);
        if (iVar9 == 2) {
          pcVar14 = "Bad URL";
LAB_0011e8fa:
          bVar5 = false;
          Curl_failf(data,pcVar14);
          ppcVar27 = (char **)0x3;
          local_c0 = (_Bool *)0x14f094;
          bVar33 = false;
        }
        else if (iVar9 < 3) {
          iVar9 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar13->host).name,pbVar17)
          ;
          if (iVar9 < 1) {
            pcVar14 = "<url> malformed";
            goto LAB_0011e8fa;
          }
          local_c0 = (_Bool *)(data->set).str[7];
          ppcVar27 = (char **)0x1b;
          if (local_c0 == (_Bool *)0x0) {
            iVar9 = curl_strnequal("FTP.",(pcVar13->host).name,4);
            if (iVar9 == 0) {
              iVar9 = curl_strnequal("DICT.",(pcVar13->host).name,5);
              if (iVar9 == 0) {
                iVar9 = curl_strnequal("LDAP.",(pcVar13->host).name,5);
                if (iVar9 == 0) {
                  iVar9 = curl_strnequal("IMAP.",(pcVar13->host).name,5);
                  if (iVar9 == 0) {
                    iVar9 = curl_strnequal("SMTP.",(pcVar13->host).name,5);
                    if (iVar9 == 0) {
                      iVar9 = curl_strnequal("POP3.",(pcVar13->host).name,5);
                      local_c0 = (_Bool *)0x149c70;
                      if (iVar9 == 0) {
                        local_c0 = (_Bool *)0x149c75;
                      }
                    }
                    else {
                      local_c0 = (_Bool *)0x149c65;
                    }
                  }
                  else {
                    local_c0 = (_Bool *)0x149c5a;
                  }
                }
                else {
                  local_c0 = (_Bool *)0x149c4f;
                }
              }
              else {
                local_c0 = (_Bool *)0x149c44;
              }
            }
            else {
              local_c0 = (_Bool *)0x14a324;
            }
            bVar5 = true;
            bVar33 = true;
            goto LAB_0011f121;
          }
          bVar5 = true;
          bVar33 = true;
        }
        else {
          sVar20 = strlen((char *)&local_88);
          ppcVar27 = (char **)0x1b;
          bVar33 = true;
          if (sVar20 == 2) {
            bVar5 = false;
          }
          else {
            pcVar14 = "";
            if (1 < sVar20) {
              pcVar14 = "es";
            }
            Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar20,pcVar14);
            if ((data->change).url_alloc == true) {
              (*Curl_cfree)((data->change).url);
            }
            local_c0 = local_48;
            pcVar14 = curl_maprintf("%s://%s%s",local_c0,(pcVar13->host).name,local_b8);
            (data->change).url = pcVar14;
            if (pcVar14 == (char *)0x0) {
              bVar5 = false;
              bVar33 = false;
            }
            else {
              (data->change).url_alloc = true;
              bVar5 = false;
              bVar33 = true;
            }
LAB_0011f121:
            ppcVar27 = (char **)0x1b;
          }
        }
        bVar6 = bVar5;
        if (bVar33) goto LAB_0011f132;
      }
    }
    else {
      pcVar14 = "Illegal characters found in URL";
LAB_0011e41e:
      Curl_failf(data,pcVar14);
      ppcVar27 = (char **)0x3;
      bVar6 = false;
    }
LAB_0011e42f:
    if ((CURLcode)ppcVar27 != CURLE_OK) {
      pcVar14 = (char *)0x0;
      pcVar18 = (char *)0x0;
      CVar8 = (CURLcode)ppcVar27;
      goto LAB_0011e359;
    }
    if (bVar6) {
      pbVar17 = (byte *)curl_maprintf("%s://%s",pcVar13->handler->scheme,(data->change).url);
      if (pbVar17 == (byte *)0x0) {
        CVar10 = CURLE_OUT_OF_MEMORY;
      }
      else {
        bVar1 = *pbVar17;
        pbVar4 = pbVar17;
        while (bVar1 != 0x3a) {
          iVar9 = tolower((uint)bVar1);
          *pbVar4 = (byte)iVar9;
          bVar1 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        }
        if ((data->change).url_alloc == true) {
          (*Curl_cfree)((data->change).url);
          (data->change).url = (char *)0x0;
          (data->change).url_alloc = false;
        }
        (data->change).url = (char *)pbVar17;
        (data->change).url_alloc = true;
        CVar10 = CURLE_OK;
      }
      if (pbVar17 != (byte *)0x0) goto LAB_0011e54c;
LAB_0011eb43:
      pcVar14 = (char *)0x0;
LAB_0011eb46:
      CVar8 = CVar10;
      pcVar18 = (char *)0x0;
      goto LAB_0011e359;
    }
LAB_0011e54c:
    if (((pcVar13->given->flags & 0x40) != 0) &&
       (pcVar14 = strchr((pcVar13->data->state).path,0x3f), pcVar14 != (char *)0x0)) {
      *pcVar14 = '\0';
    }
    pcVar14 = (data->set).str[0x35];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      pcVar13->oauth_bearer = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_0011e34f;
    }
    if (((pcVar13->bits).proxy_user_passwd == true) &&
       (CVar10 = parse_proxy_auth(data,pcVar13), CVar10 != CURLE_OK)) goto LAB_0011eb43;
    pcVar14 = (data->set).str[0x15];
    if (pcVar14 == (char *)0x0) {
      pcVar18 = (char *)0x0;
LAB_0011e5f2:
      pcVar14 = (data->set).str[0x16];
      if (pcVar14 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        if (pcVar14 == (char *)0x0) {
          pcVar14 = (char *)0x0;
          Curl_failf(data,"memory shortage");
          goto LAB_0011e359;
        }
      }
      p_Var19 = (_Bool *)curl_getenv("no_proxy");
      if (p_Var19 == (_Bool *)0x0) {
        p_Var19 = (_Bool *)curl_getenv("NO_PROXY");
      }
      local_c0 = p_Var19;
      _Var32 = check_noproxy((pcVar13->host).name,(data->set).str[0x2e]);
      if ((_Var32) ||
         (((data->set).str[0x2e] == (char *)0x0 &&
          (_Var32 = check_noproxy((pcVar13->host).name,local_c0), _Var32)))) {
        (*Curl_cfree)(pcVar18);
        (*Curl_cfree)(pcVar14);
        pcVar14 = (char *)0x0;
        pcVar18 = (char *)0x0;
      }
      else if (pcVar18 == (char *)0x0 && pcVar14 == (char *)0x0) {
        pcVar18 = detect_proxy(pcVar13);
        pcVar14 = (char *)0x0;
      }
      (*Curl_cfree)(local_c0);
      if ((data->set).str[0x36] != (char *)0x0) {
        if (pcVar18 != (char *)0x0) {
          (*Curl_cfree)(pcVar18);
        }
        pcVar18 = (*Curl_cstrdup)((data->set).str[0x36]);
        pcVar13->unix_domain_socket = pcVar18;
        if (pcVar18 == (char *)0x0) goto LAB_0011e352;
        pcVar13->abstract_unix_socket = (data->set).abstract_unix_socket;
        pcVar18 = (char *)0x0;
      }
      if (pcVar18 == (char *)0x0) {
LAB_0011e733:
        pcVar18 = (char *)0x0;
      }
      else if ((*pcVar18 == '\0') || ((pcVar13->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar18);
        goto LAB_0011e733;
      }
      if (pcVar14 == (char *)0x0) {
LAB_0011e759:
        pcVar14 = (char *)0x0;
      }
      else if ((*pcVar14 == '\0') || ((pcVar13->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar14);
        goto LAB_0011e759;
      }
      if (pcVar18 == (char *)0x0 && pcVar14 == (char *)0x0) {
        (pcVar13->bits).socksproxy = false;
        lVar28 = 0x39e;
        bVar33 = false;
LAB_0011e996:
        (pcVar13->chunk).hexbuffer[lVar28 + -8] = bVar33;
        _Var32 = true;
        if ((pcVar13->bits).httpproxy == false) {
          _Var32 = (pcVar13->bits).socksproxy;
        }
        (pcVar13->bits).proxy = _Var32;
        if (_Var32 == false) {
          (pcVar13->bits).proxy = false;
          (pcVar13->bits).httpproxy = false;
          (pcVar13->bits).socksproxy = false;
          (pcVar13->bits).proxy_user_passwd = false;
          (pcVar13->bits).tunnel_proxy = false;
        }
        if (((pcVar13->given->flags & 1) != 0) && ((pcVar13->bits).httpproxy == true)) {
          (pcVar13->bits).tunnel_proxy = true;
        }
        CVar10 = parse_remote_port(data,pcVar13);
        if ((((CVar10 == CURLE_OK) &&
             (CVar10 = override_login(data,pcVar13,&local_98,&local_a0,&local_90),
             CVar10 == CURLE_OK)) &&
            (CVar10 = set_login(pcVar13,local_98,local_a0,local_90), CVar10 == CURLE_OK)) &&
           (CVar10 = parse_connect_to_slist(data,pcVar13,(data->set).connect_to), CVar10 == CURLE_OK
           )) {
          fix_hostname(pcVar13,&pcVar13->host);
          if ((pcVar13->bits).conn_to_host == true) {
            fix_hostname(pcVar13,&pcVar13->conn_to_host);
          }
          if ((pcVar13->bits).httpproxy == true) {
            fix_hostname(pcVar13,&(pcVar13->http_proxy).host);
          }
          if ((pcVar13->bits).socksproxy == true) {
            fix_hostname(pcVar13,&(pcVar13->socks_proxy).host);
          }
          if (((pcVar13->bits).conn_to_host == true) &&
             (iVar9 = Curl_strcasecompare((pcVar13->conn_to_host).name,(pcVar13->host).name),
             iVar9 != 0)) {
            (pcVar13->bits).conn_to_host = false;
          }
          if (((pcVar13->bits).conn_to_port == true) &&
             (pcVar13->conn_to_port == pcVar13->remote_port)) {
            (pcVar13->bits).conn_to_port = false;
          }
          if ((((pcVar13->bits).conn_to_host != false) || ((pcVar13->bits).conn_to_port == true)) &&
             ((pcVar13->bits).httpproxy == true)) {
            (pcVar13->bits).tunnel_proxy = true;
          }
          CVar10 = setup_connection_internals(pcVar13);
          if (CVar10 == CURLE_OK) {
            pcVar13->recv[0] = Curl_recv_plain;
            pcVar13->send[0] = Curl_send_plain;
            pcVar13->recv[1] = Curl_recv_plain;
            pcVar13->send[1] = Curl_send_plain;
            (pcVar13->bits).tcp_fastopen = (data->set).tcp_fastopen;
            if ((pcVar13->handler->flags & 0x10) == 0) {
              pcVar14 = (data->set).str[0x1b];
              (data->set).ssl.primary.CApath = (data->set).str[0x1a];
              (data->set).proxy_ssl.primary.CApath = pcVar14;
              (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
              (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
              pcVar14 = (data->set).str[0x23];
              (data->set).ssl.primary.random_file = pcVar14;
              (data->set).proxy_ssl.primary.random_file = pcVar14;
              pcVar14 = (data->set).str[0x22];
              (data->set).ssl.primary.egdsocket = pcVar14;
              (data->set).proxy_ssl.primary.egdsocket = pcVar14;
              (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
              (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
              (data->set).ssl.CRLfile = (data->set).str[0x25];
              (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
              (data->set).ssl.issuercert = (data->set).str[0x27];
              (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
              pcVar14 = (data->set).str[0];
              pcVar18 = (data->set).str[1];
              (data->set).ssl.cert = pcVar14;
              (data->set).proxy_ssl.cert = pcVar18;
              (data->set).ssl.cert_type = (data->set).str[2];
              (data->set).proxy_ssl.cert_type = (data->set).str[3];
              (data->set).ssl.key = (data->set).str[0xd];
              (data->set).proxy_ssl.key = (data->set).str[0xe];
              (data->set).ssl.key_type = (data->set).str[0x11];
              (data->set).proxy_ssl.key_type = (data->set).str[0x12];
              pcVar21 = (data->set).str[0x10];
              (data->set).ssl.key_passwd = (data->set).str[0xf];
              (data->set).proxy_ssl.key_passwd = pcVar21;
              (data->set).ssl.primary.clientcert = pcVar14;
              (data->set).proxy_ssl.primary.clientcert = pcVar18;
              _Var32 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&pcVar13->ssl_config);
              if (_Var32) {
                pcVar14 = (char *)&pcVar13->proxy_ssl_config;
                _Var32 = Curl_clone_primary_ssl_config
                                   (&(data->set).proxy_ssl.primary,(ssl_primary_config *)pcVar14);
                if (_Var32) {
                  prune_dead_connections(data);
                  if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true))
                  {
                    _Var32 = false;
                  }
                  else {
                    pcVar14 = (char *)pcVar13;
                    _Var32 = ConnectionExists(data,pcVar13,&local_68,&local_c1,&local_c2);
                  }
                  pcVar25 = local_68;
                  if (((_Var32 != false) && (local_c1 == false)) &&
                     ((pcVar14 = (char *)local_68, _Var7 = IsPipeliningPossible(data,local_68),
                      _Var7 && (pcVar25->recv_pipe->size + pcVar25->send_pipe->size != 0)))) {
                    pcVar14 = "Found connection %ld, with requests in the pipe (%zu)\n";
                    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                               pcVar25->connection_id);
                    if (((Curl_easy *)pcVar25->bundle->num_connections < local_78) &&
                       (((data->state).conn_cache)->num_connections < local_70)) {
                      pcVar14 = "We can reuse, but we want a new connection anyway\n";
                      _Var32 = false;
                      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                    }
                  }
                  pcVar25 = local_68;
                  if (_Var32 == false) {
                    if ((pcVar13->handler->flags & 0x100) != 0) {
                      if ((data->set).ssl_enable_alpn == true) {
                        (pcVar13->bits).tls_enable_alpn = true;
                      }
                      if ((data->set).ssl_enable_npn == true) {
                        (pcVar13->bits).tls_enable_npn = true;
                      }
                    }
                    bVar33 = local_c2 == false;
                    if (bVar33) {
                      pcVar14 = (char *)(data->state).conn_cache;
                      pCVar11 = (Curl_easy *)
                                Curl_conncache_find_bundle(pcVar13,(conncache *)pcVar14);
                    }
                    else {
                      pCVar11 = (Curl_easy *)0x0;
                    }
                    if (((local_78 != (Curl_easy *)0x0) && (pCVar11 != (Curl_easy *)0x0)) &&
                       (local_78 <= pCVar11->prev)) {
                      pcVar25 = find_oldest_idle_connection_in_bundle
                                          (pCVar11,(connectbundle *)pcVar14);
                      if (pcVar25 == (connectdata *)0x0) {
                        bVar33 = false;
                        Curl_infof(data,"No more connections allowed to host: %d\n",local_78);
                      }
                      else {
                        pcVar25->data = data;
                        Curl_disconnect(pcVar25,false);
                      }
                    }
                    if (((bool)(local_70 != 0 & bVar33)) &&
                       (local_70 <= ((data->state).conn_cache)->num_connections)) {
                      pcVar25 = Curl_oldest_idle_connection(data);
                      if (pcVar25 == (connectdata *)0x0) {
                        bVar33 = false;
                        Curl_infof(data,"No connections available in cache\n");
                      }
                      else {
                        pcVar25->data = data;
                        Curl_disconnect(pcVar25,false);
                      }
                    }
                    if (bVar33) {
                      Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
                      if ((((data->state).authhost.picked & 0x28) != 0) &&
                         ((data->state).authhost.done == true)) {
                        Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                        (data->state).authhost.picked = 0;
                        (data->state).authhost.done = false;
                      }
                      CVar8 = CURLE_OK;
                      if ((((data->state).authproxy.picked & 0x28) != 0) &&
                         ((data->state).authproxy.done == true)) {
                        CVar8 = CURLE_OK;
                        Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                        (data->state).authproxy.picked = 0;
                        (data->state).authproxy.done = false;
                      }
                    }
                    else {
                      Curl_infof(data,"No connections available.\n");
                      conn_free(pcVar13);
                      *in_connect = (connectdata *)0x0;
                      CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
                    }
                    if (!bVar33) goto LAB_0011e34f;
                  }
                  else {
                    local_68->inuse = true;
                    reuse_conn(pcVar13,local_68);
                    (*Curl_cfree)(pcVar13);
                    *in_connect = pcVar25;
                    pcVar14 = "host";
                    if ((pcVar25->bits).proxy != false) {
                      pcVar14 = "proxy";
                    }
                    lVar28 = 0x110;
                    if (((pcVar25->socks_proxy).host.name == (char *)0x0) &&
                       (lVar28 = 0x150, (pcVar25->http_proxy).host.name == (char *)0x0)) {
                      lVar28 = 200;
                    }
                    Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                               pcVar25->connection_id,pcVar14,
                               *(undefined8 *)((pcVar25->chunk).hexbuffer + lVar28 + -8));
                    pcVar13 = pcVar25;
                  }
                  pcVar13->inuse = true;
                  Curl_init_do(data,pcVar13);
                  CVar8 = setup_range(data);
                  if (CVar8 == CURLE_OK) {
                    pcVar13->seek_func = (data->set).seek_func;
                    pcVar13->seek_client = (data->set).seek_client;
                    CVar8 = resolve_server(data,pcVar13,asyncp);
                  }
                }
              }
            }
            else {
              CVar8 = (*pcVar13->handler->connect_it)(pcVar13,local_48);
              if (CVar8 == CURLE_OK) {
                pcVar13->data = data;
                (pcVar13->bits).tcpconnect[0] = true;
                Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
                CVar8 = setup_range(data);
                if (CVar8 != CURLE_OK) {
                  (*pcVar13->handler->done)(pcVar13,CVar8,false);
                  goto LAB_0011e34f;
                }
                CVar8 = CURLE_OK;
                Curl_setup_transfer(pcVar13,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              }
              Curl_init_do(data,pcVar13);
            }
            goto LAB_0011e34f;
          }
        }
        goto LAB_0011eb43;
      }
      if (pcVar18 == (char *)0x0) {
LAB_0011e79e:
        if (pcVar14 != (char *)0x0) {
          CVar10 = parse_proxy(data,pcVar13,pcVar14,(pcVar13->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar14);
          if (CVar10 != CURLE_OK) goto LAB_0011eb43;
        }
        pcVar14 = (pcVar13->http_proxy).host.rawalloc;
        if (pcVar14 == (char *)0x0) {
          (pcVar13->bits).httpproxy = false;
          lVar28 = 0x3a9;
          cVar26 = '\0';
        }
        else {
          cVar26 = '\x01';
          lVar28 = 0x39e;
          if (((pcVar13->handler->protocol & 3) == 0) && ((pcVar13->bits).tunnel_proxy == false)) {
            pcVar13->handler = &Curl_handler_http;
          }
        }
        (pcVar13->chunk).hexbuffer[lVar28 + -8] = cVar26;
        bVar33 = (pcVar13->socks_proxy).host.rawalloc != (char *)0x0;
        lVar28 = 0x39f;
        if ((bVar33 && pcVar14 == (char *)0x0) &&
           (bVar33 = true, (pcVar13->socks_proxy).user == (char *)0x0)) {
          pcVar14 = (pcVar13->socks_proxy).passwd;
          (pcVar13->socks_proxy).user = (pcVar13->http_proxy).user;
          (pcVar13->http_proxy).user = (char *)0x0;
          (*Curl_cfree)(pcVar14);
          (pcVar13->socks_proxy).passwd = (pcVar13->http_proxy).passwd;
          (pcVar13->http_proxy).passwd = (char *)0x0;
        }
        goto LAB_0011e996;
      }
      CVar10 = parse_proxy(data,pcVar13,pcVar18,(pcVar13->http_proxy).proxytype);
      local_c0 = (_Bool *)CONCAT44(local_c0._4_4_,CVar10);
      (*Curl_cfree)(pcVar18);
      CVar10 = (CURLcode)local_c0;
      if ((CURLcode)local_c0 == CURLE_OK) goto LAB_0011e79e;
      goto LAB_0011eb46;
    }
    pcVar18 = (*Curl_cstrdup)(pcVar14);
    if (pcVar18 != (char *)0x0) goto LAB_0011e5f2;
    pcVar14 = (char *)0x0;
    Curl_failf(data,"memory shortage");
  }
LAB_0011e352:
  pcVar18 = (char *)0x0;
LAB_0011e359:
  (*Curl_cfree)(local_90);
  (*Curl_cfree)(local_a0);
  (*Curl_cfree)(local_98);
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(pcVar18);
  if (CVar8 == CURLE_OK) {
    pcVar13 = *in_connect;
    if ((pcVar13->send_pipe->size == 0) && (pcVar13->recv_pipe->size == 0)) {
      CVar8 = CURLE_OK;
      if (*asyncp == false) {
        CVar8 = Curl_setup_conn(pcVar13,local_50);
      }
    }
    else {
      *local_50 = true;
      CVar8 = CURLE_OK;
    }
  }
  if (CVar8 != CURLE_OK) {
    if (CVar8 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar8;
      }
      Curl_disconnect(*in_connect,false);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar8;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}